

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

wstring * __thiscall
NJamSpell::TSpellCorrector::FixFragmentNormalized
          (wstring *__return_storage_ptr__,TSpellCorrector *this,wstring *text)

{
  undefined4 *puVar1;
  pointer pwVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  wstring *pwVar7;
  ulong uVar8;
  long lVar9;
  size_t position;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  TWords candidates;
  TWord local_a8;
  undefined1 local_98 [8];
  wstring lowered;
  undefined1 local_70 [8];
  TSentences sentences;
  TWords words;
  wstring *result;
  
  local_98 = (undefined1  [8])&lowered._M_string_length;
  pwVar2 = (text->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_98,pwVar2,pwVar2 + text->_M_string_length);
  ToLower((wstring *)local_98);
  TLangModel::Tokenize((TSentences *)local_70,&this->LangModel,(wstring *)local_98);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if ((undefined1  [8])
      sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != local_70) {
    uVar8 = 0;
    do {
      lowered.field_2._8_8_ = uVar8;
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 &sentences.
                  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 ((long)local_70 + uVar8 * 0x18));
      if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)sentences.
                   super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        lVar9 = 0;
        position = 0;
        do {
          GetCandidatesRaw((TWords *)local_d0,this,
                           (TWords *)
                           &sentences.
                            super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,position);
          if ((undefined1  [8])
              candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_start != local_d0) {
            uVar4 = *(undefined4 *)((long)(wchar_t **)local_d0 + 4);
            sVar6 = *(size_t *)((long)local_d0 + 8);
            uVar5 = *(undefined4 *)((long)((long)local_d0 + 8) + 4);
            puVar1 = (undefined4 *)
                     ((long)&((sentences.
                               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar9);
            *puVar1 = *(undefined4 *)(wchar_t **)local_d0;
            puVar1[1] = uVar4;
            puVar1[2] = (int)sVar6;
            puVar1[3] = uVar5;
          }
          lVar3 = *(long *)((long)&((sentences.
                                     super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar9);
          local_f0[0] = local_e0;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)local_f0,lVar3,
                     lVar3 + *(long *)((long)&((sentences.
                                                super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ->
                                              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                              )._M_impl.super__Vector_impl_data._M_finish + lVar9) *
                             4);
          pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_f0);
          std::__cxx11::wstring::wstring
                    ((wstring *)
                     &candidates.
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,pwVar7);
          std::__cxx11::wstring::_M_append
                    ((wchar_t *)__return_storage_ptr__,
                     (ulong)candidates.
                            super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != &local_a8) {
            operator_delete(candidates.
                            super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0]);
          }
          if (local_d0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_d0);
          }
          position = position + 1;
          lVar9 = lVar9 + 0x10;
        } while (position <
                 (ulong)((long)words.
                               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)sentences.
                               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 4));
      }
      if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)sentences.
                   super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::__cxx11::wstring::resize
                  ((ulong)__return_storage_ptr__,
                   (int)__return_storage_ptr__->_M_string_length + L'\xffffffff');
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
      }
      if (sentences.
          super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(sentences.
                        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      uVar8 = lowered.field_2._8_8_ + 1;
    } while (uVar8 < (ulong)(((long)sentences.
                                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)local_70 >> 3)
                            * -0x5555555555555555));
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::wstring::resize
              ((ulong)__return_storage_ptr__,
               (int)__return_storage_ptr__->_M_string_length + L'\xffffffff');
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_70);
  if (local_98 != (undefined1  [8])&lowered._M_string_length) {
    operator_delete((void *)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring TSpellCorrector::FixFragmentNormalized(const std::wstring& text) const {
    std::wstring lowered = text;
    ToLower(lowered);
    TSentences sentences = LangModel.Tokenize(lowered);
    std::wstring result;
    for (size_t i = 0; i < sentences.size(); ++i) {
        TWords words = sentences[i];
        for (size_t i = 0; i < words.size(); ++i) {
            TWords candidates = GetCandidatesRaw(words, i);
            if (candidates.size() > 0) {
                words[i] = candidates[0];
            }
            result += std::wstring(words[i].Ptr, words[i].Len) + L" ";
        }
        if (words.size() > 0) {
            result.resize(result.size() - 1);
            result += L". ";
        }
    }
    if (!result.empty()) {
        result.resize(result.size() - 1);
    }
    return result;
}